

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O0

OPJ_BOOL opj_j2k_write_tile(opj_j2k_t *p_j2k,OPJ_UINT32 p_tile_index,OPJ_BYTE *p_data,
                           OPJ_UINT32 p_data_size,opj_stream_private_t *p_stream,
                           opj_event_mgr_t *p_manager)

{
  OPJ_BOOL OVar1;
  opj_tcd_tilecomp_t *l_tilec;
  OPJ_UINT32 j;
  opj_event_mgr_t *p_manager_local;
  opj_stream_private_t *p_stream_local;
  OPJ_UINT32 p_data_size_local;
  OPJ_BYTE *p_data_local;
  OPJ_UINT32 p_tile_index_local;
  opj_j2k_t *p_j2k_local;
  
  OVar1 = opj_j2k_pre_write_tile(p_j2k,p_tile_index,p_stream,p_manager);
  if (OVar1 == 0) {
    opj_event_msg(p_manager,1,"Error while opj_j2k_pre_write_tile with tile index = %d\n",
                  (ulong)p_tile_index);
    p_j2k_local._4_4_ = 0;
  }
  else {
    for (l_tilec._4_4_ = 0; l_tilec._4_4_ < p_j2k->m_tcd->image->numcomps;
        l_tilec._4_4_ = l_tilec._4_4_ + 1) {
      OVar1 = opj_alloc_tile_component_data(p_j2k->m_tcd->tcd_image->tiles->comps + l_tilec._4_4_);
      if (OVar1 == 0) {
        opj_event_msg(p_manager,1,"Error allocating tile component data.");
        return 0;
      }
    }
    OVar1 = opj_tcd_copy_tile_data(p_j2k->m_tcd,p_data,(ulong)p_data_size);
    if (OVar1 == 0) {
      opj_event_msg(p_manager,1,"Size mismatch between tile data and sent data.");
      p_j2k_local._4_4_ = 0;
    }
    else {
      OVar1 = opj_j2k_post_write_tile(p_j2k,p_stream,p_manager);
      if (OVar1 == 0) {
        opj_event_msg(p_manager,1,"Error while opj_j2k_post_write_tile with tile index = %d\n",
                      (ulong)p_tile_index);
        p_j2k_local._4_4_ = 0;
      }
      else {
        p_j2k_local._4_4_ = 1;
      }
    }
  }
  return p_j2k_local._4_4_;
}

Assistant:

OPJ_BOOL opj_j2k_write_tile(opj_j2k_t * p_j2k,
                            OPJ_UINT32 p_tile_index,
                            OPJ_BYTE * p_data,
                            OPJ_UINT32 p_data_size,
                            opj_stream_private_t *p_stream,
                            opj_event_mgr_t * p_manager)
{
    if (! opj_j2k_pre_write_tile(p_j2k, p_tile_index, p_stream, p_manager)) {
        opj_event_msg(p_manager, EVT_ERROR,
                      "Error while opj_j2k_pre_write_tile with tile index = %d\n", p_tile_index);
        return OPJ_FALSE;
    } else {
        OPJ_UINT32 j;
        /* Allocate data */
        for (j = 0; j < p_j2k->m_tcd->image->numcomps; ++j) {
            opj_tcd_tilecomp_t* l_tilec = p_j2k->m_tcd->tcd_image->tiles->comps + j;

            if (! opj_alloc_tile_component_data(l_tilec)) {
                opj_event_msg(p_manager, EVT_ERROR, "Error allocating tile component data.");
                return OPJ_FALSE;
            }
        }

        /* now copy data into the tile component */
        if (! opj_tcd_copy_tile_data(p_j2k->m_tcd, p_data, p_data_size)) {
            opj_event_msg(p_manager, EVT_ERROR,
                          "Size mismatch between tile data and sent data.");
            return OPJ_FALSE;
        }
        if (! opj_j2k_post_write_tile(p_j2k, p_stream, p_manager)) {
            opj_event_msg(p_manager, EVT_ERROR,
                          "Error while opj_j2k_post_write_tile with tile index = %d\n", p_tile_index);
            return OPJ_FALSE;
        }
    }

    return OPJ_TRUE;
}